

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O2

void __thiscall
Transaction_CommitTwoSeparateTransactions_Test::TestBody
          (Transaction_CommitTwoSeparateTransactions_Test *this)

{
  char *message;
  mock_mutex mutex;
  unique_lock<mock_mutex> local_178;
  transaction<std::unique_lock<mock_mutex>_> t1;
  database db;
  
  pstore::database::database<pstore::file::in_memory>
            (&db,&(this->super_Transaction).store_.file_,true);
  db.vacuum_mode_ = disabled;
  std::unique_lock<mock_mutex>::unique_lock(&local_178,&mutex);
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction(&t1,&db,&local_178);
  std::unique_lock<mock_mutex>::~unique_lock(&local_178);
  anon_unknown.dwarf_32ce0a::append_int(&t1,1);
  pstore::transaction_base::commit(&t1.super_transaction_base);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction(&t1);
  std::unique_lock<mock_mutex>::unique_lock(&local_178,&mutex);
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction(&t1,&db,&local_178);
  std::unique_lock<mock_mutex>::~unique_lock(&local_178);
  anon_unknown.dwarf_32ce0a::append_int(&t1,2);
  pstore::transaction_base::commit(&t1.super_transaction_base);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction(&t1);
  pstore::database::~database(&db);
  t1.super_transaction_base._vptr_transaction_base = (_func_int **)&DAT_00000130;
  local_178._M_device =
       *(mutex_type **)
        ((this->super_Transaction).store_.buffer_.
         super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x28);
  testing::internal::
  CmpHelperEQ<pstore::typed_address<pstore::trailer>,pstore::typed_address<pstore::trailer>>
            ((internal *)&db,"pstore::typed_address<pstore::trailer>::make (footer2)",
             "header->footer_pos.load ()",(typed_address<pstore::trailer> *)&t1,
             (typed_address<pstore::trailer> *)&local_178);
  if ((char)db._vptr_database == '\0') {
    testing::Message::Message((Message *)&t1);
    if ((__uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
         )db.storage_.sat_._M_t.
          super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
          .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)db.storage_.sat_._M_t.
                          super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
                          .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>.
                          _M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x1a4,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)&t1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
    if (t1.super_transaction_base._vptr_transaction_base != (_func_int **)0x0) {
      (**(code **)(*t1.super_transaction_base._vptr_transaction_base + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&db.storage_);
  return;
}

Assistant:

TEST_F (Transaction, CommitTwoSeparateTransactions) {
    // Append two individual transactions, each containing a single int.
    {
        pstore::database db{store_.file ()};
        db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);
        mock_mutex mutex;
        {
            auto t1 = begin (db, mock_lock (mutex));
            append_int (t1, 1);
            t1.commit ();
        }
        {
            auto t2 = begin (db, mock_lock (mutex));
            append_int (t2, 2);
            t2.commit ();
        }
    }

    std::size_t footer2 = pstore::leader_size;
    footer2 += pstore::calc_alignment (footer2, alignof (pstore::trailer));
    footer2 += sizeof (pstore::trailer);

    footer2 += pstore::calc_alignment (footer2, alignof (int));
    footer2 += sizeof (int);
    footer2 += pstore::calc_alignment (footer2, alignof (pstore::trailer));
    footer2 += sizeof (pstore::trailer);

    footer2 += pstore::calc_alignment (footer2, alignof (int));
    footer2 += sizeof (int);
    footer2 += pstore::calc_alignment (footer2, alignof (pstore::trailer));

    pstore::header const * const header = this->get_header ();
    EXPECT_EQ (pstore::typed_address<pstore::trailer>::make (footer2), header->footer_pos.load ());
}